

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O0

Syntax google::protobuf::util::anon_unknown_1::ConvertSyntax(Edition edition)

{
  undefined4 local_c;
  Edition edition_local;
  
  if (edition == EDITION_PROTO2) {
    local_c = SYNTAX_PROTO2;
  }
  else if (edition == EDITION_PROTO3) {
    local_c = SYNTAX_PROTO3;
  }
  else {
    local_c = SYNTAX_EDITIONS;
  }
  return local_c;
}

Assistant:

Syntax ConvertSyntax(Edition edition) {
  switch (edition) {
    case Edition::EDITION_PROTO2:
      return Syntax::SYNTAX_PROTO2;
    case Edition::EDITION_PROTO3:
      return Syntax::SYNTAX_PROTO3;
    default:
      return Syntax::SYNTAX_EDITIONS;
  }
}